

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PorterGobbleVC(char *zStem,int nStem,int bPrevCons)

{
  int iVar1;
  int iVar2;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  int bCons;
  int i;
  uint local_20;
  int local_1c;
  
  local_20 = in_EDX;
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    iVar1 = fts5PorterIsVowel(*(char *)(in_RDI + local_1c),local_20);
    local_20 = (iVar1 != 0 ^ 0xff) & 1;
    if (local_20 == 0) break;
  }
  do {
    iVar1 = local_1c;
    local_1c = iVar1 + 1;
    if (in_ESI <= local_1c) {
      return 0;
    }
    iVar2 = fts5PorterIsVowel(*(char *)(in_RDI + local_1c),local_20);
    local_20 = (uint)(iVar2 == 0);
  } while (iVar2 != 0);
  return iVar1 + 2;
}

Assistant:

static int fts5PorterGobbleVC(char *zStem, int nStem, int bPrevCons){
  int i;
  int bCons = bPrevCons;

  /* Scan for a vowel */
  for(i=0; i<nStem; i++){
    if( 0==(bCons = !fts5PorterIsVowel(zStem[i], bCons)) ) break;
  }

  /* Scan for a consonent */
  for(i++; i<nStem; i++){
    if( (bCons = !fts5PorterIsVowel(zStem[i], bCons)) ) return i+1;
  }
  return 0;
}